

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O3

void print_symbol_names(TextBuffer *buf,LuaSymbolList *list)

{
  bool bVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  char *format;
  PtrListIterator nodeiter__;
  PtrListIterator PStack_48;
  
  raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)list);
  puVar2 = (undefined4 *)raviX_ptrlist_iter_next(&PStack_48);
  if (puVar2 != (undefined4 *)0x0) {
    bVar1 = true;
    do {
      if (!bVar1) {
        printf_buf(buf,", ");
      }
      switch(*puVar2) {
      case 0:
      case 2:
      case 4:
        uVar3 = *(undefined8 *)(puVar2 + 6);
LAB_00113c86:
        format = "%t";
        break;
      case 1:
        uVar3 = *(undefined8 *)(*(int **)(puVar2 + 6) + 6);
        if (**(int **)(puVar2 + 6) != 4) goto LAB_00113c86;
        format = "%t*";
        break;
      case 3:
        uVar3 = *(undefined8 *)(puVar2 + 2);
        format = "%t:";
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_printer.c"
                      ,0xc5,"void print_symbol_name(TextBuffer *, LuaSymbol *)");
      }
      printf_buf(buf,format,uVar3);
      puVar2 = (undefined4 *)raviX_ptrlist_iter_next(&PStack_48);
      bVar1 = false;
    } while (puVar2 != (undefined4 *)0x0);
  }
  return;
}

Assistant:

static void print_symbol_names(TextBuffer *buf, LuaSymbolList *list)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else
			printf_buf(buf, ", ");
		print_symbol_name(buf, node);
	}
	END_FOR_EACH_PTR(node);
}